

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ctmbstr tidyOptGetNextMutedMessage(TidyDoc tdoc,TidyIterator *iter)

{
  undefined8 local_28;
  ctmbstr result;
  TidyDocImpl *impl;
  TidyIterator *iter_local;
  TidyDoc tdoc_local;
  
  local_28 = (ctmbstr)0x0;
  if (tdoc == (TidyDoc)0x0) {
    if (iter != (TidyIterator *)0x0) {
      *iter = (TidyIterator)0x0;
    }
  }
  else {
    local_28 = prvTidygetNextMutedMessage((TidyDocImpl *)tdoc,iter);
  }
  return local_28;
}

Assistant:

ctmbstr TIDY_CALL      tidyOptGetNextMutedMessage(TidyDoc tdoc, TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr result = NULL;
    if ( impl )
        result = TY_(getNextMutedMessage)( impl, iter );
    else if ( iter )
        *iter = 0;
    return result;
}